

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O3

void __thiscall spdlog::details::file_helper::flush(file_helper *this)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar2 = fflush((FILE *)this->fd_);
  if (iVar2 == 0) {
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->filename_)._M_string_length);
  std::operator+(&local_30,"Failed flush to file ",&local_50);
  piVar3 = __errno_location();
  throw_spdlog_ex(&local_30,*piVar3);
}

Assistant:

SPDLOG_INLINE void file_helper::flush() {
    if (std::fflush(fd_) != 0) {
        throw_spdlog_ex("Failed flush to file " + os::filename_to_str(filename_), errno);
    }
}